

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

lua_Number lua_tonumberx(lua_State *L,int idx,int *ok)

{
  int iVar1;
  TValue *pTVar2;
  ulong uVar3;
  TValue tmp;
  TValue local_10;
  
  pTVar2 = index2adr(L,idx);
  uVar3 = pTVar2->it64 >> 0x2f;
  if (uVar3 < 0xfffffffffffffff3) {
    if (ok != (int *)0x0) {
      *ok = 1;
    }
    local_10 = (TValue)pTVar2->u64;
  }
  else if ((uVar3 == 0xfffffffffffffffb) &&
          (iVar1 = lj_strscan_num((GCstr *)(pTVar2->it64 & 0x7fffffffffff),&local_10), iVar1 != 0))
  {
    if (ok != (int *)0x0) {
      *ok = 1;
    }
  }
  else {
    local_10.u64 = 0;
    if (ok != (int *)0x0) {
      *ok = 0;
    }
  }
  return (lua_Number)local_10.u64;
}

Assistant:

LUA_API lua_Number lua_tonumberx(lua_State *L, int idx, int *ok)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o))) {
    if (ok) *ok = 1;
    return numberVnum(o);
  } else if (tvisstr(o) && lj_strscan_num(strV(o), &tmp)) {
    if (ok) *ok = 1;
    return numV(&tmp);
  } else {
    if (ok) *ok = 0;
    return 0;
  }
}